

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.cc
# Opt level: O0

uint cnn::mp::SpawnChildren
               (vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *workloads)

{
  __pid_t _Var1;
  size_type sVar2;
  size_type sVar3;
  ostream *this;
  reference pvVar4;
  vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *in_RDI;
  uint cid;
  pid_t pid;
  uint num_children;
  uint local_1c;
  
  sVar2 = std::vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>::size(in_RDI);
  sVar3 = std::vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>::size(in_RDI);
  if (sVar3 != (sVar2 & 0xffffffff)) {
    __assert_fail("workloads.size() == num_children",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/mp.cc"
                  ,0x2e,"unsigned int cnn::mp::SpawnChildren(std::vector<Workload> &)");
  }
  local_1c = 0;
  while( true ) {
    if ((uint)sVar2 <= local_1c) {
      return local_1c;
    }
    _Var1 = fork();
    if (_Var1 == -1) break;
    if (_Var1 == 0) {
      return local_1c;
    }
    pvVar4 = std::vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>::operator[]
                       (in_RDI,(ulong)local_1c);
    pvVar4->pid = _Var1;
    local_1c = local_1c + 1;
  }
  this = std::operator<<((ostream *)&std::cerr,"Fork failed. Exiting ...");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

unsigned SpawnChildren(std::vector<Workload>& workloads) {
      const unsigned num_children = workloads.size();
      assert (workloads.size() == num_children);
      pid_t pid;
      unsigned cid;
      for (cid = 0; cid < num_children; ++cid) {
        pid = fork();
        if (pid == -1) {
          std::cerr << "Fork failed. Exiting ..." << std::endl;
          return 1;
        }
        else if (pid == 0) {
          // children shouldn't continue looping
          break;
        }
        workloads[cid].pid = pid;
      }
      return cid;
    }